

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derDec4(octet *der,size_t count,u32 tag,void *val,size_t len)

{
  bool_t bVar1;
  size_t *in_RCX;
  int in_EDX;
  u32 *in_RSI;
  octet *in_R8;
  size_t l;
  octet *v;
  u32 t;
  octet *local_48;
  void *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  size_t local_8;
  
  local_8 = derDec(in_RSI,(octet **)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8,
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if ((((local_8 == 0xffffffffffffffff) || (in_stack_ffffffffffffffcc != in_EDX)) ||
      (local_48 != in_R8)) || (bVar1 = memEq(local_40,in_RCX,(size_t)in_R8), bVar1 == 0)) {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t derDec4(const octet der[], size_t count, u32 tag, const void* val,
	size_t len)
{
	u32 t;
	const octet* v;
	size_t l;
	ASSERT(memIsValid(val, len));
	count = derDec(&t, &v, &l, der, count);
	if (count == SIZE_MAX || t != tag || l != len || !memEq(v, val, len))
		return SIZE_MAX;
	return count;
}